

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O1

string * cmSearchPathStripBin(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = (s->_M_dataplus)._M_p;
  local_20._M_len = s->_M_string_length;
  if (local_20._M_len < 4) {
LAB_0023969f:
    local_20._M_str = (s->_M_dataplus)._M_p;
    local_20._M_len = s->_M_string_length;
    if (4 < local_20._M_len) {
      __str_00._M_str = "/sbin";
      __str_00._M_len = 5;
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_20,local_20._M_len - 5,5,__str_00);
      if (iVar2 == 0) goto LAB_002396f4;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + s->_M_string_length);
  }
  else {
    __str._M_str = "/bin";
    __str._M_len = 4;
    iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_20,local_20._M_len - 4,4,__str);
    if (iVar2 != 0) goto LAB_0023969f;
LAB_002396f4:
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,s);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSearchPathStripBin(std::string const& s)
{
  // If the path is a PREFIX/bin case then add its parent instead.
  if ((cmHasLiteralSuffix(s, "/bin")) || (cmHasLiteralSuffix(s, "/sbin"))) {
    return cmSystemTools::GetFilenamePath(s);
  }
  return s;
}